

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ClearOpsBufferStorageTestCase::execute
          (ClearOpsBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ostringstream *poVar1;
  byte bVar2;
  byte bVar3;
  GLenum GVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  bool bVar13;
  uint data_rgba8;
  uint local_1f8;
  undefined4 local_1ec;
  ulong local_1e8;
  char *local_1e0;
  ulong local_1d8;
  long local_1d0;
  char *local_1c8;
  void *local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1ec = 0x12345678;
  bVar7 = true;
  local_1b8 = 0;
  do {
    bVar13 = (int)local_1b8 != 0;
    local_1c8 = "glClearBufferSubData()";
    if (!bVar13) {
      local_1c8 = "glClearBufferData()";
    }
    local_1d0 = (ulong)bVar13 * 3 + 0x13;
    local_1e8 = 0;
    do {
      uVar9 = local_1b8;
      if ((int)local_1e8 != 0) {
        (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bo);
        GVar4 = (*this->m_gl->getError)();
        glu::checkError(GVar4,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x678);
        uVar5 = (ulong)(this->m_sparse_bo_size_rounded >> 1);
        (*this->m_gl->bufferPageCommitmentARB)(0x8892,uVar5,uVar5,'\x01');
        GVar4 = (*this->m_gl->getError)();
        glu::checkError(GVar4,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x67d);
      }
      (*this->m_gl->bindBuffer)(0x8892,this->m_helper_bo);
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x682);
      (*this->m_gl->bufferSubData)
                (0x8892,0,(ulong)this->m_sparse_bo_size_rounded,this->m_initial_data);
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x686);
      (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
      (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glBindBuffer() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x68a);
      (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x691);
      local_1f8 = this->m_sparse_bo_size_rounded;
      if ((int)uVar9 == 0) {
        (*this->m_gl->clearBufferData)(0x8f37,0x8058,0x1908,0x1401,&local_1ec);
        GVar4 = (*this->m_gl->getError)();
        glu::checkError(GVar4,"glClearBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x69f);
        uVar6 = 0;
      }
      else {
        uVar6 = local_1f8 >> 1;
        (*this->m_gl->clearBufferSubData)
                  (0x8f37,0x8058,(ulong)uVar6,(ulong)uVar6,0x1908,0x1401,&local_1ec);
        GVar4 = (*this->m_gl->getError)();
        glu::checkError(GVar4,"glClearBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x6ab);
        local_1f8 = uVar6;
      }
      (*this->m_gl->copyBufferSubData)(0x8f37,0x8f36,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6b6);
      local_1c0 = (*this->m_gl->mapBufferRange)(0x8f36,0,(ulong)this->m_sparse_bo_size_rounded,1);
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6bb);
      bVar13 = true;
      bVar12 = 1;
      if (uVar6 != 0) {
        local_1e0 = "no";
        if ((int)local_1e8 == 0) {
          local_1e0 = "yes";
        }
        local_1d8 = (ulong)((int)local_1e8 == 0) | 2;
        bVar12 = 1;
        lVar8 = 0;
        do {
          bVar2 = this->m_initial_data[lVar8];
          bVar3 = *(byte *)((long)local_1c0 + lVar8);
          if (bVar2 != bVar3) {
            local_1b0._0_8_ = this->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "Unmodified buffer object region has invalid contents. Expected byte ",0x44);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
            std::ostream::operator<<(poVar1,(uint)bVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"], found byte:[",0xf);
            std::ostream::operator<<(poVar1,(uint)bVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] at index [",0xc)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"]; call type:[",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_1c8,local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"], all required pages committed?:[",0x22);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_1e0,local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar12 = 0;
            break;
          }
          lVar8 = lVar8 + 1;
        } while ((uint)lVar8 < uVar6);
      }
      if ((int)local_1e8 != 0) {
        local_1f8 = 0;
      }
      if (uVar6 < local_1f8 + uVar6) {
        local_1e0 = "no";
        if ((int)local_1e8 == 0) {
          local_1e0 = "yes";
        }
        local_1d8 = (ulong)((int)local_1e8 == 0) | 2;
        uVar9 = (ulong)uVar6;
        iVar10 = uVar6 << 3;
        bVar13 = true;
        do {
          bVar2 = *(byte *)((long)local_1c0 + uVar9);
          uVar11 = (0xff << ((byte)iVar10 & 0x1f) & 0x12345678U) >> ((byte)iVar10 & 0x1f) & 0x7e;
          if (uVar11 != bVar2) {
            local_1b0._0_8_ = this->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "Unmodified buffer object region has invalid contents. Expected byte ",0x44);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
            std::ostream::operator<<(poVar1,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"], found byte:[",0xf);
            std::ostream::operator<<(poVar1,(uint)bVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] at index [",0xc)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"]; call type:[",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_1c8,local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"], all required pages committed?:[",0x22);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_1e0,local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar13 = false;
          }
        } while (((uVar11 == bVar2) && (uVar9 = uVar9 + 1, (uint)uVar9 < local_1f8 + uVar6)) &&
                (iVar10 = iVar10 + 8, bVar13));
      }
      bVar7 = (bool)(bVar7 & bVar12 & bVar13);
      (*this->m_gl->unmapBuffer)(0x8f36);
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x710);
      iVar10 = (int)local_1e8;
      local_1e8 = (ulong)(iVar10 + 1);
    } while (iVar10 == 0);
    iVar10 = (int)local_1b8;
    local_1b8 = (ulong)(iVar10 + 1);
    if (iVar10 != 0) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool ClearOpsBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool			   result	 = true;
	const unsigned int data_rgba8 = 0x12345678;

	for (unsigned int n_clear_op_type = 0; n_clear_op_type < 2; /* glClearBufferData(), glClearBufferSubData() */
		 ++n_clear_op_type)
	{
		const bool use_clear_buffer_data_call = (n_clear_op_type == 0);

		/* We will run the test case in two iterations:
		 *
		 * 1) All pages will have a physical backing.
		 * 2) Half of the pages will have a physical backing.
		 */
		for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
		{
			/* By default, for each iteration all sparse buffer pages are commited.
			 *
			 * For the last iteration, we need to de-commit the latter half before
			 * proceeding with the test.
			 */
			const bool all_pages_committed = (n_iteration == 0);

			if (!all_pages_committed)
			{
				m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

				m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, m_sparse_bo_size_rounded / 2, /* offset */
											 m_sparse_bo_size_rounded / 2,					/* size   */
											 GL_TRUE);										/* commit */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			/* Set up the sparse buffer contents */
			m_gl.bindBuffer(GL_ARRAY_BUFFER, m_helper_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

			m_gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							   m_sparse_bo_size_rounded, m_initial_data);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");

			m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
			m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER,  /* readTarget  */
								   GL_COPY_WRITE_BUFFER, /* writeTarget */
								   0,					 /* readOffset */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			/* Issue the clear call */
			unsigned int clear_region_size		   = 0;
			unsigned int clear_region_start_offset = 0;

			if (use_clear_buffer_data_call)
			{
				DE_ASSERT((m_sparse_bo_size_rounded % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded;
				clear_region_start_offset = 0;

				m_gl.clearBufferData(GL_COPY_WRITE_BUFFER, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");
			}
			else
			{
				DE_ASSERT(((m_sparse_bo_size_rounded / 2) % sizeof(unsigned int)) == 0);
				DE_ASSERT(((m_sparse_bo_size_rounded) % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded / 2;
				clear_region_start_offset = m_sparse_bo_size_rounded / 2;

				m_gl.clearBufferSubData(GL_COPY_WRITE_BUFFER, GL_RGBA8, clear_region_start_offset, clear_region_size,
										GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferSubData() call failed.");
			}

			/* Retrieve the modified buffer's contents */
			const unsigned char* result_data = NULL;

			m_gl.copyBufferSubData(GL_COPY_WRITE_BUFFER, /* readTarget  */
								   GL_COPY_READ_BUFFER,  /* writeTarget */
								   0,					 /* readOffset  */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			result_data = (unsigned char*)m_gl.mapBufferRange(GL_COPY_READ_BUFFER, 0, /* offset */
															  m_sparse_bo_size_rounded, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the result data: unmodified region */
			bool			   result_local			  = true;
			const unsigned int unmodified_region_size = (use_clear_buffer_data_call) ? 0 : clear_region_start_offset;
			const unsigned int unmodified_region_start_offset = 0;

			for (unsigned int n_current_byte = unmodified_region_start_offset;
				 (n_current_byte < unmodified_region_start_offset + unmodified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned int  current_initial_data_offset = n_current_byte - unmodified_region_start_offset;
				const unsigned char expected_value				= m_initial_data[current_initial_data_offset];
				const unsigned char found_value					= result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;
			result_local = true;

			/* Verify the result data: modified region (clamped to the memory region
			 * with actual physical backing) */
			const unsigned int modified_region_size			= (all_pages_committed) ? clear_region_size : 0;
			const unsigned int modified_region_start_offset = clear_region_start_offset;

			for (unsigned int n_current_byte = modified_region_start_offset;
				 (n_current_byte < modified_region_start_offset + modified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned char expected_value =
					static_cast<unsigned char>((data_rgba8 & (0xFF << (n_current_byte * 8))) >> (n_current_byte * 8));
				const unsigned char found_value = result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;

			/* Unmap the storage before proceeding */
			m_gl.unmapBuffer(GL_COPY_READ_BUFFER);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (both iterations) */
	}	 /* for (both clear types) */

	return result;
}